

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

Status __thiscall
leveldb::ReadBlock(leveldb *this,RandomAccessFile *file,Options *dbOptions,ReadOptions *options,
                  BlockHandle *handle,BlockContents *result)

{
  ulong uVar1;
  int iVar2;
  uint64_t uVar3;
  long *plVar4;
  DecompressAllocator *pDVar5;
  Status SVar6;
  ReadOptions *pRVar7;
  size_t __n;
  char cVar8;
  uint32_t uVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  Status s;
  string buffer;
  Slice contents;
  Status local_b8;
  leveldb *local_b0;
  char *local_a8;
  ReadOptions *local_a0;
  Slice local_98;
  char local_88 [16];
  Options *local_78;
  char *local_70;
  ulong local_68;
  Slice local_60 [2];
  Slice local_40;
  
  (result->data).data_ = "";
  (result->data).size_ = 0;
  result->cachable = false;
  result->heap_allocated = false;
  uVar3 = handle->size_;
  uVar1 = uVar3 + 5;
  local_a0 = options;
  local_78 = dbOptions;
  pcVar10 = (char *)operator_new__(uVar1);
  local_70 = "";
  local_68 = 0;
  (*file->_vptr_RandomAccessFile[2])(&local_b8,file,handle->offset_,uVar1,&local_70,pcVar10);
  pcVar11 = local_70;
  pRVar7 = local_a0;
  if (local_b8.state_ == (char *)0x0) {
    local_b0 = this;
    local_a8 = pcVar10;
    if (local_68 != uVar1) {
      operator_delete__(pcVar10);
      this = local_b0;
      local_98.data_ = "truncated block read";
      local_98.size_ = 0x14;
      local_60[0].data_ = "";
      local_60[0].size_ = 0;
      Status::Corruption((Status *)local_b0,&local_98,local_60);
      goto LAB_0010d63f;
    }
    if ((local_a0->verify_checksums != true) ||
       (iVar2 = *(int *)(local_70 + uVar3 + 1), uVar9 = crc32c::Value(local_70,uVar3 + 1),
       uVar9 == ((iVar2 + 0x5d7d1528U) * 0x8000 | iVar2 + 0x5d7d1528U >> 0x11))) {
      if (pcVar11[uVar3] == 0) {
        if (pcVar11 == local_a8) {
          (result->data).data_ = local_a8;
          (result->data).size_ = uVar3;
          result->cachable = true;
          result->heap_allocated = true;
          this = local_b0;
        }
        else {
          operator_delete__(local_a8);
          (result->data).data_ = pcVar11;
          (result->data).size_ = uVar3;
          result->cachable = false;
          result->heap_allocated = false;
          this = local_b0;
        }
      }
      else {
        lVar12 = 0;
        do {
          if ((lVar12 == 0x800) ||
             (plVar4 = *(long **)((long)local_78->compressors + lVar12), plVar4 == (long *)0x0)) {
            operator_delete__(local_a8);
            this = local_b0;
            local_98.data_ = "encountered a block compressed with an unknown decompressor";
            local_98.size_ = 0x3b;
            local_60[0].data_ = "";
            local_60[0].size_ = 0;
            Status::NotSupported((Status *)local_b0,&local_98,local_60);
            goto LAB_0010d63f;
          }
          lVar12 = lVar12 + 8;
        } while ((int)(char)plVar4[3] != (uint)(byte)pcVar11[uVar3]);
        local_98.data_ = local_88;
        local_98.size_ = 0;
        local_88[0] = '\0';
        if (pRVar7->decompress_allocator != (DecompressAllocator *)0x0) {
          (*pRVar7->decompress_allocator->_vptr_DecompressAllocator[2])(local_60);
          std::__cxx11::string::operator=((string *)&local_98,(string *)local_60);
          std::__cxx11::string::_M_dispose();
        }
        cVar8 = (**(code **)(*plVar4 + 0x18))(plVar4,pcVar11,uVar3,&local_98);
        __n = local_98.size_;
        if (cVar8 != '\0') {
          pcVar11 = (char *)operator_new__(local_98.size_);
          memcpy(pcVar11,local_98.data_,__n);
          (result->data).data_ = pcVar11;
          (result->data).size_ = __n;
          result->cachable = true;
          result->heap_allocated = true;
        }
        operator_delete__(local_a8);
        pDVar5 = local_a0->decompress_allocator;
        if (pDVar5 != (DecompressAllocator *)0x0) {
          (*pDVar5->_vptr_DecompressAllocator[3])(pDVar5,&local_98);
        }
        this = local_b0;
        if (cVar8 == '\0') {
          local_60[0].data_ = "corrupted compressed block contents";
          local_60[0].size_ = 0x23;
          local_40.data_ = "";
          local_40.size_ = 0;
          Status::Corruption((Status *)local_b0,local_60,&local_40);
          std::__cxx11::string::_M_dispose();
          goto LAB_0010d63f;
        }
        std::__cxx11::string::_M_dispose();
      }
      *(undefined8 *)this = 0;
      goto LAB_0010d63f;
    }
    operator_delete__(local_a8);
    local_98.data_ = "block checksum mismatch";
    local_98.size_ = 0x17;
    local_60[0].data_ = "";
    local_60[0].size_ = 0;
    Status::Corruption((Status *)&local_40,&local_98,local_60);
    SVar6.state_ = local_b8.state_;
    local_b8.state_ = local_40.data_;
    local_40.data_ = SVar6.state_;
    Status::~Status((Status *)&local_40);
    this = local_b0;
  }
  else {
    operator_delete__(pcVar10);
  }
  *(char **)this = local_b8.state_;
  local_b8.state_ = (char *)0x0;
LAB_0010d63f:
  Status::~Status(&local_b8);
  return (Status)(char *)this;
}

Assistant:

Status ReadBlock(RandomAccessFile* file, const Options& dbOptions, const ReadOptions& options,
                 const BlockHandle& handle, BlockContents* result) {
  result->data = Slice();
  result->cachable = false;
  result->heap_allocated = false;

  // Read the block contents as well as the type/crc footer.
  // See table_builder.cc for the code that built this structure.
  size_t n = static_cast<size_t>(handle.size());
  char* buf = new char[n + kBlockTrailerSize];
  Slice contents;
  Status s = file->Read(handle.offset(), n + kBlockTrailerSize, &contents, buf);
  if (!s.ok()) {
    delete[] buf;
    return s;
  }
  if (contents.size() != n + kBlockTrailerSize) {
    delete[] buf;
    return Status::Corruption("truncated block read");
  }

  // Check the crc of the type and the block contents
  const char* data = contents.data();  // Pointer to where Read put the data
  if (options.verify_checksums) {
    const uint32_t crc = crc32c::Unmask(DecodeFixed32(data + n + 1));
    const uint32_t actual = crc32c::Value(data, n + 1);
    if (actual != crc) {
      delete[] buf;
      s = Status::Corruption("block checksum mismatch");
      return s;
    }
  }

		unsigned char compressionID = data[n];

		if (compressionID == 0) {
			if (data != buf) {
				// File implementation gave us pointer to some other data.
				// Use it directly under the assumption that it will be live
				// while the file is open.
				delete[] buf;
				result->data = Slice(data, n);
				result->heap_allocated = false;
				result->cachable = false;  // Do not double-cache
			}
			else {
				result->data = Slice(buf, n);
				result->heap_allocated = true;
				result->cachable = true;
			}
		}
		else {

			//find the required compressor
			Compressor* compressor = nullptr;
			for (auto& c : dbOptions.compressors) {
				if (!c || c->uniqueCompressionID == compressionID) {
					compressor = c;
					break;
				}
			}

			if (compressor == nullptr) {
				delete[] buf;
				return Status::NotSupported("encountered a block compressed with an unknown decompressor");
			}

			std::string buffer;
			if (options.decompress_allocator) {
				buffer = options.decompress_allocator->get();
			}

			bool success = compressor->decompress(data, n, buffer);

			if (success) {
				auto ubuf = new char[buffer.size()];
				memcpy(ubuf, buffer.data(), buffer.size());
				result->data = Slice(ubuf, buffer.size());
				result->heap_allocated = true;
				result->cachable = true;
			}

			delete[] buf;
			
			if (options.decompress_allocator) {
				options.decompress_allocator->release(std::move(buffer));
			}

			if (!success) {
				return Status::Corruption("corrupted compressed block contents");
			}
		}

		return Status::OK();
	}